

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O3

Action __thiscall
psy::C::DeclarationBinder::visitArrayOrFunctionDeclarator
          (DeclarationBinder *this,ArrayOrFunctionDeclaratorSyntax *node)

{
  iterator *piVar1;
  _Elt_pointer ppTVar2;
  _Elt_pointer ppFVar3;
  Action AVar4;
  TypeKind TVar5;
  SyntaxKind SVar6;
  Type *pTVar7;
  ostream *poVar8;
  int iVar9;
  SyntaxToken *__return_storage_ptr__;
  SpecifierListSyntax *pSVar10;
  FunctionType *funcTy;
  Type *local_a8;
  SyntaxToken local_a0;
  SyntaxToken local_68;
  
  for (pSVar10 = node->attrs1_; pSVar10 != (SpecifierListSyntax *)0x0;
      pSVar10 = (pSVar10->
                super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                ).
                super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                .next) {
    AVar4 = SyntaxVisitor::visit
                      (&this->super_SyntaxVisitor,
                       &((pSVar10->
                         super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                         ).
                         super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                        .value)->super_SyntaxNode);
    if (AVar4 == Quit) {
      return Quit;
    }
  }
  SVar6 = SyntaxNode::kind(&node->suffix_->super_SyntaxNode);
  if (SVar6 == ParameterSuffix) {
    ppTVar2 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar2 !=
        (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      if (ppTVar2 ==
          (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pTVar7 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
      }
      else {
        pTVar7 = ppTVar2[-1];
      }
      if (pTVar7 != (Type *)0x0) {
        TVar5 = Type::kind(pTVar7);
        if (TVar5 == Array) {
          __return_storage_ptr__ = &local_a0;
          SyntaxNode::firstToken(__return_storage_ptr__,&node->innerDecltor_->super_SyntaxNode);
          DiagnosticsReporter::FunctionReturningArray(&this->diagReporter_,__return_storage_ptr__);
        }
        else {
          if (TVar5 == Error) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[ASSERT] at ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x114);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<empty message>",0xf);
            std::endl<char,std::char_traits<char>>(poVar8);
            return Quit;
          }
          if (TVar5 != Function) goto LAB_002d5d3f;
          __return_storage_ptr__ = &local_68;
          SyntaxNode::firstToken(__return_storage_ptr__,&node->innerDecltor_->super_SyntaxNode);
          DiagnosticsReporter::FunctionReturningFunction
                    (&this->diagReporter_,__return_storage_ptr__);
        }
        SyntaxToken::~SyntaxToken(__return_storage_ptr__);
LAB_002d5d3f:
        pTVar7 = &makeType<psy::C::FunctionType,psy::C::Type*>(this,pTVar7)->super_Type;
        local_a8 = pTVar7;
        pushType(this,pTVar7);
        ppFVar3 = (this->pendingFuncTys_).c.
                  super__Deque_base<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppFVar3 ==
            (this->pendingFuncTys_).c.
            super__Deque_base<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<psy::C::FunctionType*,std::allocator<psy::C::FunctionType*>>::
          _M_push_back_aux<psy::C::FunctionType*const&>
                    ((deque<psy::C::FunctionType*,std::allocator<psy::C::FunctionType*>> *)
                     &this->pendingFuncTys_,(FunctionType **)&local_a8);
        }
        else {
          *ppFVar3 = (FunctionType *)pTVar7;
          piVar1 = &(this->pendingFuncTys_).c.
                    super__Deque_base<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        AVar4 = SyntaxVisitor::visit
                          (&this->super_SyntaxVisitor,&node->innerDecltor_->super_SyntaxNode);
        if (AVar4 == Quit) {
          return Quit;
        }
        for (pSVar10 = node->attrs2_; pSVar10 != (SpecifierListSyntax *)0x0;
            pSVar10 = (pSVar10->
                      super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                      ).
                      super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                      .next) {
          AVar4 = SyntaxVisitor::visit
                            (&this->super_SyntaxVisitor,
                             &((pSVar10->
                               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                               ).
                               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                              .value)->super_SyntaxNode);
          if (AVar4 == Quit) {
            return Quit;
          }
        }
        AVar4 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
        if (AVar4 != Quit) {
          pushNewScope(this,(SyntaxNode *)node,FunctionPrototype,true);
          AVar4 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->suffix_->super_SyntaxNode);
          if (AVar4 != Quit) {
            popAndStashScope(this);
            std::deque<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>::pop_back
                      (&(this->pendingFuncTys_).c);
            return Skip;
          }
          return Quit;
        }
        return Quit;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar9 = 0xff;
  }
  else if (SVar6 == SubscriptSuffix) {
    ppTVar2 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar2 !=
        (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      if (ppTVar2 ==
          (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pTVar7 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
      }
      else {
        pTVar7 = ppTVar2[-1];
      }
      if (pTVar7 != (Type *)0x0) {
        pTVar7 = &makeType<psy::C::ArrayType,psy::C::Type*>(this,pTVar7)->super_Type;
        pushType(this,pTVar7);
        AVar4 = SyntaxVisitor::visit
                          (&this->super_SyntaxVisitor,&node->innerDecltor_->super_SyntaxNode);
        if (AVar4 == Quit) {
          return Quit;
        }
        pSVar10 = node->attrs2_;
        while( true ) {
          if (pSVar10 == (SpecifierListSyntax *)0x0) {
            AVar4 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
            return (AVar4 == Quit) + Skip;
          }
          AVar4 = SyntaxVisitor::visit
                            (&this->super_SyntaxVisitor,
                             &((pSVar10->
                               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                               ).
                               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                              .value)->super_SyntaxNode);
          if (AVar4 == Quit) break;
          pSVar10 = (pSVar10->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    .next;
        }
        return Quit;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar9 = 0xf6;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar9 = 0x127;
  }
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<empty message>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  return Quit;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitArrayOrFunctionDeclarator(const ArrayOrFunctionDeclaratorSyntax* node)
{
    VISIT(node->attributes());

    switch (node->suffix()->kind()) {
        case SyntaxKind::SubscriptSuffix: {
            TY_AT_TOP(auto ty, Action::Quit);
            pushType(makeType<ArrayType>(ty));
            VISIT(node->innerDeclarator());
            VISIT(node->attributes_PostDeclarator());
            VISIT(node->initializer());
            return Action::Skip;
        }

        case SyntaxKind::ParameterSuffix: {
            TY_AT_TOP(auto ty, Action::Quit);
            switch (ty->kind()) {
                case TypeKind::Function:
                    diagReporter_.FunctionReturningFunction(
                                node->innerDeclarator()->firstToken());
                    break;

                case TypeKind::Array:
                    diagReporter_.FunctionReturningArray(
                                node->innerDeclarator()->firstToken());
                    break;

                case TypeKind::Pointer:
                case TypeKind::Basic:
                case TypeKind::Void:
                case TypeKind::Qualified:
                case TypeKind::Tag:
                case TypeKind::TypedefName:
                    break;

                case TypeKind::Error:
                    PSY_ASSERT_1(false);
                    return Action::Quit;
            }
            auto funcTy = makeType<FunctionType>(ty);
            pushType(funcTy);
            pendingFuncTys_.push(funcTy);

            VISIT(node->innerDeclarator());
            VISIT(node->attributes_PostDeclarator());
            VISIT(node->initializer());
            pushNewScope(node, ScopeKind::FunctionPrototype, true);
            VISIT(node->suffix());
            popAndStashScope();

            pendingFuncTys_.pop();
            return Action::Skip;
        }

        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }
}